

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.cpp
# Opt level: O0

QString * language::boolValue(bool v)

{
  Language LVar1;
  byte in_SIL;
  QString *in_RDI;
  long in_FS_OFFSET;
  char16_t *str;
  char16_t *str_1;
  DataPointer *in_stack_ffffffffffffff68;
  QArrayDataPointer<char16_t> *in_stack_ffffffffffffff70;
  undefined1 *this;
  QArrayDataPointer<char16_t> local_38;
  QArrayDataPointer<char16_t> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  LVar1 = language();
  if (LVar1 == Cpp) {
    if ((in_SIL & 1) == 0) {
      this = cppFalse;
    }
    else {
      this = cppTrue;
    }
    QString::QString((QString *)this,(QString *)in_stack_ffffffffffffff68);
  }
  else if (LVar1 == Python) {
    if ((in_SIL & 1) == 0) {
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_38,(Data *)0x0,L"False",5);
      QString::QString((QString *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_ffffffffffffff70);
    }
    else {
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_20,(Data *)0x0,L"True",4);
      QString::QString((QString *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_ffffffffffffff70);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString boolValue(bool v)
{
    switch (language()) {
    case Language::Cpp:
        return v ? cppTrue : cppFalse;
    case Language::Python:
        return v ? QStringLiteral("True") : QStringLiteral("False");
    }
    Q_UNREACHABLE();
}